

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

int stbir_resize_extended_split(STBIR_RESIZE *resize,int split_start,int split_count)

{
  int iVar1;
  
  if (resize->samplers == (stbir__info *)0x0) {
    __assert_fail("resize->samplers",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                  ,0x1ef8,"int stbir_resize_extended_split(STBIR_RESIZE *, int, int)");
  }
  if ((split_start != -1) && ((split_start != 0 || (resize->splits != split_count)))) {
    iVar1 = 0;
    if ((resize->needs_rebuild == 0) &&
       ((iVar1 = 0, -1 < split_start && split_start < resize->splits &&
        (iVar1 = 0, 0 < split_count && split_count + split_start <= resize->splits)))) {
      stbir__perform_resize(resize->samplers,split_start,split_count);
      iVar1 = 1;
    }
    return iVar1;
  }
  iVar1 = stbir_resize_extended(resize);
  return iVar1;
}

Assistant:

STBIRDEF int stbir_resize_extended_split( STBIR_RESIZE * resize, int split_start, int split_count )
{
  STBIR_ASSERT( resize->samplers );

  // if we're just doing the whole thing, call full
  if ( ( split_start == -1 ) || ( ( split_start == 0 ) && ( split_count == resize->splits ) ) )
    return stbir_resize_extended( resize );

  // you **must** build samplers first when using split resize
  if ( ( resize->samplers == 0 ) || ( resize->needs_rebuild ) )
    return 0;

  if ( ( split_start >= resize->splits ) || ( split_start < 0 ) || ( ( split_start + split_count ) > resize->splits ) || ( split_count <= 0 ) )
    return 0;

  // do resize
  return stbir__perform_resize( resize->samplers, split_start, split_count );
}